

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O3

void __thiscall SceneRender::renderBackground(SceneRender *this,Uniforms *_uniforms)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TextureCube *pTVar2;
  int iVar3;
  Vbo *pVVar4;
  Vbo *this_00;
  undefined8 *puVar5;
  undefined4 extraout_var_00;
  long lVar6;
  _Alloc_hider _Var7;
  Shader *pSVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  mat<4,_4,_float,_(glm::qualifier)0> Result;
  mat4 ori;
  mat4 local_138;
  string local_f8;
  undefined1 local_d8 [4];
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 aStack_d4;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 aStack_d0;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_cc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c8;
  undefined8 uStack_b8;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_b0;
  undefined8 uStack_ac;
  undefined8 uStack_a4;
  anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9 aStack_9c;
  undefined4 extraout_var;
  
  if (this->m_background == true) {
    if ((_uniforms->tracker).m_running == true) {
      _local_d8 = (pointer)&aStack_c8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"render:scene:background","");
      Tracker::begin(&_uniforms->tracker,(string *)local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_d8 != &aStack_c8) {
        operator_delete(_local_d8,
                        CONCAT44(aStack_c8._M_allocated_capacity._4_4_,
                                 aStack_c8._M_allocated_capacity._0_4_) + 1);
      }
    }
    glDisable(0xb71);
    pSVar8 = &this->m_background_shader;
    vera::Shader::use(pSVar8);
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_138.value + 1);
    local_138.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u_modelMatrix","");
    local_d8 = (undefined1  [4])0x3f800000;
    aStack_d4.y = 0.0;
    aStack_d0.z = 0.0;
    aStack_cc.w = 0.0;
    aStack_c8._M_allocated_capacity._0_4_ = 0;
    aStack_c8._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_c8._8_8_ = 0;
    uStack_b8 = (pointer)0x0;
    local_b0.z = 1.0;
    uStack_ac = 0;
    uStack_a4._0_4_ = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    uStack_a4._4_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    aStack_9c.w = 1.0;
    vera::Shader::setUniform(pSVar8,(string *)&local_138,(mat4 *)local_d8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_138.value[0]._0_8_,
                      CONCAT44(local_138.value[1].field_1,local_138.value[1].field_0) + 1);
    }
    local_138.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u_viewMatrix","");
    local_d8 = (undefined1  [4])0x3f800000;
    aStack_d4.y = 0.0;
    aStack_d0.z = 0.0;
    aStack_cc.w = 0.0;
    aStack_c8._M_allocated_capacity._0_4_ = 0;
    aStack_c8._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_c8._8_8_ = 0;
    uStack_b8 = (pointer)0x0;
    local_b0.z = 1.0;
    uStack_ac = 0;
    uStack_a4._0_4_ = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    uStack_a4._4_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    aStack_9c.w = 1.0;
    vera::Shader::setUniform(pSVar8,(string *)&local_138,(mat4 *)local_d8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_138.value[0]._0_8_,
                      CONCAT44(local_138.value[1].field_1,local_138.value[1].field_0) + 1);
    }
    local_138.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u_projectionMatrix","");
    local_d8 = (undefined1  [4])0x3f800000;
    aStack_d4.y = 0.0;
    aStack_d0.z = 0.0;
    aStack_cc.w = 0.0;
    aStack_c8._M_allocated_capacity._0_4_ = 0;
    aStack_c8._M_allocated_capacity._4_4_ = 0x3f800000;
    aStack_c8._8_8_ = 0;
    uStack_b8 = (pointer)0x0;
    local_b0.z = 1.0;
    uStack_ac = 0;
    uStack_a4._0_4_ = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    uStack_a4._4_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    aStack_9c.w = 1.0;
    vera::Shader::setUniform(pSVar8,(string *)&local_138,(mat4 *)local_d8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_138.value[0]._0_8_,
                      CONCAT44(local_138.value[1].field_1,local_138.value[1].field_0) + 1);
    }
    local_138.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_138,"u_modelViewProjectionMatrix","");
    local_d8 = (undefined1  [4])0x3f800000;
    aStack_d4.y = 0.0;
    aStack_d0.z = 0.0;
    aStack_cc.w = 0.0;
    aStack_c8._M_allocated_capacity._0_4_ = 0.0;
    aStack_c8._M_allocated_capacity._4_4_ = 1.0;
    aStack_c8._8_8_ = 0;
    uStack_b8 = (pointer)0x0;
    local_b0.z = 1.0;
    uStack_ac = 0;
    uStack_a4._0_4_ = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0;
    uStack_a4._4_4_ = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0;
    aStack_9c.w = 1.0;
    vera::Shader::setUniform(pSVar8,(string *)&local_138,(mat4 *)local_d8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_138.value[0]._0_8_,
                      CONCAT44(local_138.value[1].field_1,local_138.value[1].field_0) + 1);
    }
    (*(_uniforms->super_Scene)._vptr_Scene[0x3e])(_uniforms,pSVar8,1,1);
    pVVar4 = vera::getBillboard();
    vera::Vbo::render(pVVar4,pSVar8);
    if ((_uniforms->tracker).m_running != true) {
      return;
    }
    _local_d8 = (pointer)&aStack_c8;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"render:scene:background","")
    ;
    Tracker::end(&_uniforms->tracker,(string *)local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_d8 == &aStack_c8) {
      return;
    }
    lVar6 = CONCAT44(aStack_c8._M_allocated_capacity._4_4_,aStack_c8._M_allocated_capacity._0_4_);
    _Var7._M_p = _local_d8;
  }
  else {
    pTVar2 = (_uniforms->super_Scene).activeCubemap;
    if (pTVar2 == (TextureCube *)0x0) {
      return;
    }
    if (this->showCubebox != true) {
      return;
    }
    iVar3 = (*(pTVar2->super_Texture)._vptr_Texture[9])();
    if ((char)iVar3 == '\0') {
      return;
    }
    if ((_uniforms->tracker).m_running == true) {
      _local_d8 = (pointer)&aStack_c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d8,"render:scene:cubemap","");
      Tracker::begin(&_uniforms->tracker,(string *)local_d8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_d8 != &aStack_c8) {
        operator_delete(_local_d8,
                        CONCAT44(aStack_c8._M_allocated_capacity._4_4_,
                                 aStack_c8._M_allocated_capacity._0_4_) + 1);
      }
    }
    glDisable(0xb71);
    if ((this->m_cubemap_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>
        ._M_t.super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
        super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl == (Vbo *)0x0) {
      this_00 = (Vbo *)operator_new(0x60);
      vera::cubeMesh((Mesh *)local_d8,1.0);
      vera::Vbo::Vbo(this_00,(Mesh *)local_d8);
      pVVar4 = (this->m_cubemap_vbo)._M_t.
               super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
               super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
               super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl;
      (this->m_cubemap_vbo)._M_t.super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>.
      _M_t.super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
      super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl = this_00;
      if (pVVar4 != (Vbo *)0x0) {
        (*pVVar4->_vptr_Vbo[1])();
      }
      vera::Mesh::~Mesh((Mesh *)local_d8);
    }
    (*(((_uniforms->super_Scene).activeCamera)->super_Node)._vptr_Node[0x1c])(local_d8);
    pSVar8 = &this->m_cubemap_shader;
    vera::Shader::use(pSVar8);
    paVar1 = &local_f8.field_2;
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f8,"u_modelViewProjectionMatrix","");
    iVar3 = (*(((_uniforms->super_Scene).activeCamera)->super_Node)._vptr_Node[0x59])();
    puVar5 = (undefined8 *)CONCAT44(extraout_var,iVar3);
    fVar9 = (float)puVar5[6];
    fVar10 = (float)((ulong)puVar5[6] >> 0x20);
    fVar23 = (float)*puVar5;
    fVar24 = (float)((ulong)*puVar5 >> 0x20);
    fVar21 = (float)puVar5[2];
    fVar22 = (float)((ulong)puVar5[2] >> 0x20);
    fVar19 = (float)puVar5[4];
    fVar20 = (float)((ulong)puVar5[4] >> 0x20);
    local_138.value[0].field_0.x =
         fVar9 * aStack_cc.w +
         fVar19 * aStack_d0.z + fVar21 * aStack_d4.y + fVar23 * (float)local_d8;
    local_138.value[0].field_1.y =
         fVar10 * aStack_cc.w +
         fVar20 * aStack_d0.z + fVar22 * aStack_d4.y + fVar24 * (float)local_d8;
    fVar15 = (float)puVar5[1];
    fVar16 = (float)((ulong)puVar5[1] >> 0x20);
    fVar17 = (float)puVar5[3];
    fVar18 = (float)((ulong)puVar5[3] >> 0x20);
    fVar13 = (float)puVar5[5];
    fVar14 = (float)((ulong)puVar5[5] >> 0x20);
    fVar11 = (float)puVar5[7];
    fVar12 = (float)((ulong)puVar5[7] >> 0x20);
    local_138.value[0].field_2.z =
         aStack_cc.w * fVar11 +
         aStack_d0.z * fVar13 + aStack_d4.y * fVar17 + (float)local_d8 * fVar15;
    local_138.value[0].field_3.w =
         aStack_cc.w * fVar12 +
         aStack_d0.z * fVar14 + aStack_d4.y * fVar18 + (float)local_d8 * fVar16;
    local_138.value[1].field_0.x =
         fVar9 * (float)aStack_c8._12_4_ +
         fVar19 * (float)aStack_c8._8_4_ +
         fVar21 * (float)aStack_c8._M_allocated_capacity._4_4_ +
         fVar23 * (float)aStack_c8._M_allocated_capacity._0_4_;
    local_138.value[1].field_1.y =
         fVar10 * (float)aStack_c8._12_4_ +
         fVar20 * (float)aStack_c8._8_4_ +
         fVar22 * (float)aStack_c8._M_allocated_capacity._4_4_ +
         fVar24 * (float)aStack_c8._M_allocated_capacity._0_4_;
    local_138.value[1].field_3.w =
         (float)aStack_c8._12_4_ * fVar12 +
         (float)aStack_c8._8_4_ * fVar14 +
         (float)aStack_c8._M_allocated_capacity._4_4_ * fVar18 +
         (float)aStack_c8._M_allocated_capacity._0_4_ * fVar16;
    local_138.value[1].field_2.z =
         (float)aStack_c8._12_4_ * fVar11 +
         (float)aStack_c8._8_4_ * fVar13 +
         (float)aStack_c8._M_allocated_capacity._4_4_ * fVar17 +
         (float)aStack_c8._M_allocated_capacity._0_4_ * fVar15;
    local_138.value[2].field_2.z =
         uStack_ac._0_4_ * fVar11 +
         local_b0.z * fVar13 + uStack_b8._4_4_ * fVar17 + uStack_b8._0_4_ * fVar15;
    local_138.value[2].field_1.y =
         fVar10 * uStack_ac._0_4_ +
         fVar20 * local_b0.z + fVar22 * uStack_b8._4_4_ + fVar24 * uStack_b8._0_4_;
    local_138.value[2].field_0.x =
         fVar9 * uStack_ac._0_4_ +
         fVar19 * local_b0.z + fVar21 * uStack_b8._4_4_ + fVar23 * uStack_b8._0_4_;
    local_138.value[3].field_3.w =
         aStack_9c.w * fVar12 +
         uStack_a4._4_4_ * fVar14 + uStack_a4._0_4_ * fVar18 + uStack_ac._4_4_ * fVar16;
    local_138.value[3].field_0.x =
         fVar9 * aStack_9c.w +
         fVar19 * uStack_a4._4_4_ + fVar21 * uStack_a4._0_4_ + fVar23 * uStack_ac._4_4_;
    local_138.value[2].field_3.w =
         uStack_ac._0_4_ * fVar12 +
         local_b0.z * fVar14 + uStack_b8._4_4_ * fVar18 + uStack_b8._0_4_ * fVar16;
    local_138.value[3].field_2.z =
         aStack_9c.w * fVar11 +
         uStack_a4._4_4_ * fVar13 + uStack_a4._0_4_ * fVar17 + uStack_ac._4_4_ * fVar15;
    local_138.value[3].field_1.y =
         fVar10 * aStack_9c.w +
         fVar20 * uStack_a4._4_4_ + fVar22 * uStack_a4._0_4_ + fVar24 * uStack_ac._4_4_;
    vera::Shader::setUniform(pSVar8,&local_f8,&local_138,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    local_f8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"u_modelMatrix","");
    local_138.value[0].field_0.x = 1.0;
    local_138.value[0].field_1.y = 0.0;
    local_138.value[0].field_2.z = 0.0;
    local_138.value[0].field_3.w = 0.0;
    local_138.value[1].field_0.x = 0.0;
    local_138.value[1].field_1.y = 1.0;
    local_138.value[1].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0
    ;
    local_138.value[1].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0
    ;
    local_138.value[2].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0
    ;
    local_138.value[2].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0
    ;
    local_138.value[2].field_2.z = 1.0;
    local_138.value[2].field_3 = (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x0
    ;
    local_138.value[3].field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0
    ;
    local_138.value[3].field_1 = (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x0
    ;
    local_138.value[3].field_2 = (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x0
    ;
    local_138.value[3].field_3.w = 1.0;
    vera::Shader::setUniform(pSVar8,&local_f8,&local_138,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
    }
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_138.value + 1);
    local_138.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u_viewMatrix","");
    vera::Shader::setUniform(pSVar8,(string *)&local_138,(mat4 *)local_d8,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_138.value[0]._0_8_,
                      CONCAT44(local_138.value[1].field_1,local_138.value[1].field_0) + 1);
    }
    local_138.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u_projectionMatrix","");
    iVar3 = (*(((_uniforms->super_Scene).activeCamera)->super_Node)._vptr_Node[0x59])();
    vera::Shader::setUniform
              (pSVar8,(string *)&local_138,(mat4 *)CONCAT44(extraout_var_00,iVar3),false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_138.value[0]._0_8_,
                      CONCAT44(local_138.value[1].field_1,local_138.value[1].field_0) + 1);
    }
    local_138.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"u_cubeMap","");
    vera::Shader::setUniformTextureCube
              (pSVar8,(string *)&local_138,(_uniforms->super_Scene).activeCubemap,0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.value[0]._0_8_ != paVar1) {
      operator_delete((void *)local_138.value[0]._0_8_,
                      CONCAT44(local_138.value[1].field_1,local_138.value[1].field_0) + 1);
    }
    vera::Vbo::render((this->m_cubemap_vbo)._M_t.
                      super___uniq_ptr_impl<vera::Vbo,_std::default_delete<vera::Vbo>_>._M_t.
                      super__Tuple_impl<0UL,_vera::Vbo_*,_std::default_delete<vera::Vbo>_>.
                      super__Head_base<0UL,_vera::Vbo_*,_false>._M_head_impl,pSVar8);
    if ((_uniforms->tracker).m_running != true) {
      return;
    }
    local_138.value[0]._0_8_ = paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"render:scene:cubemap","");
    Tracker::end(&_uniforms->tracker,(string *)&local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.value[0]._0_8_ == paVar1) {
      return;
    }
    lVar6 = CONCAT44(local_138.value[1].field_1,local_138.value[1].field_0);
    _Var7._M_p = (pointer)local_138.value[0]._0_8_;
  }
  operator_delete(_Var7._M_p,lVar6 + 1);
  return;
}

Assistant:

void SceneRender::renderBackground(Uniforms& _uniforms) {
    if (m_background) {
        TRACK_BEGIN("render:scene:background")
        glDisable(GL_DEPTH_TEST);

        m_background_shader.use();
        m_background_shader.setUniform("u_modelMatrix", glm::mat4(1.0));
        m_background_shader.setUniform("u_viewMatrix", glm::mat4(1.0));
        m_background_shader.setUniform("u_projectionMatrix", glm::mat4(1.0));
        m_background_shader.setUniform("u_modelViewProjectionMatrix", glm::mat4(1.0));

        // Update Uniforms and textures
        _uniforms.feedTo( &m_background_shader );

        vera::getBillboard()->render( &m_background_shader );

        TRACK_END("render:scene:background")
    }

    else if (_uniforms.activeCubemap) {
        if (showCubebox && _uniforms.activeCubemap->loaded()) {
            TRACK_BEGIN("render:scene:cubemap")

            glDisable(GL_DEPTH_TEST);

            if (!m_cubemap_vbo)
                m_cubemap_vbo = std::unique_ptr<vera::Vbo>(new vera::Vbo( vera::cubeMesh(1.0f) ));

            glm::mat4 ori = _uniforms.activeCamera->getOrientationMatrix();

            #if defined(__EMSCRIPTEN__)
            if (vera::getXR() == vera::VR_MODE)
                ori = glm::inverse(ori);
            #endif

            m_cubemap_shader.use();
            m_cubemap_shader.setUniform("u_modelViewProjectionMatrix", _uniforms.activeCamera->getProjectionMatrix() * ori);
            m_cubemap_shader.setUniform("u_modelMatrix", glm::mat4(1.0));
            m_cubemap_shader.setUniform("u_viewMatrix", ori);
            m_cubemap_shader.setUniform("u_projectionMatrix", _uniforms.activeCamera->getProjectionMatrix());
            m_cubemap_shader.setUniformTextureCube("u_cubeMap", _uniforms.activeCubemap, 0);
            m_cubemap_vbo->render(&m_cubemap_shader);

            TRACK_END("render:scene:cubemap")
        }
    }
}